

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O2

void __thiscall
dlib::
array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
::push_back(array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
            *this,unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>
                  *item)

{
  unsigned_long uVar1;
  thread_function *ptVar2;
  unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_> *puVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  unsigned_long i;
  ulong uVar5;
  array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  temp;
  array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  local_58;
  
  uVar1 = this->max_array_size;
  iVar4 = (*(this->
            super_enumerable<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>_>
            )._vptr_enumerable[8])();
  if (uVar1 == CONCAT44(extraout_var,iVar4)) {
    local_58.
    super_enumerable<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>_>
    ._vptr_enumerable = (_func_int **)&PTR__array_00331bb0;
    local_58.pool._vptr_memory_manager_stateless_kernel_1 =
         (_func_int **)&PTR__memory_manager_stateless_kernel_1_00331c30;
    local_58.last_pos =
         (unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_> *)0x0;
    local_58.array_size = 0;
    local_58.max_array_size = 0;
    local_58.array_elements =
         (unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_> *)0x0;
    local_58.pos = (unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_> *
                   )0x0;
    local_58._at_start = true;
    iVar4 = (*(this->
              super_enumerable<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>_>
              )._vptr_enumerable[8])(this);
    set_max_size(&local_58,CONCAT44(extraout_var_00,iVar4) * 2 + 1);
    iVar4 = (*(this->
              super_enumerable<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>_>
              )._vptr_enumerable[8])(this);
    set_size(&local_58,CONCAT44(extraout_var_01,iVar4) + 1);
    uVar5 = 0;
    while( true ) {
      iVar4 = (*(this->
                super_enumerable<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>_>
                )._vptr_enumerable[8])(this);
      if (CONCAT44(extraout_var_02,iVar4) <= uVar5) break;
      ptVar2 = this->array_elements[uVar5]._M_t.
               super___uniq_ptr_impl<dlib::thread_function,_std::default_delete<dlib::thread_function>_>
               ._M_t.
               super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>
               .super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl;
      this->array_elements[uVar5]._M_t.
      super___uniq_ptr_impl<dlib::thread_function,_std::default_delete<dlib::thread_function>_>._M_t
      .super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>.
      super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl =
           local_58.array_elements[uVar5]._M_t.
           super___uniq_ptr_impl<dlib::thread_function,_std::default_delete<dlib::thread_function>_>
           ._M_t.
           super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>
           .super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl;
      local_58.array_elements[uVar5]._M_t.
      super___uniq_ptr_impl<dlib::thread_function,_std::default_delete<dlib::thread_function>_>._M_t
      .super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>.
      super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl = ptVar2;
      uVar5 = uVar5 + 1;
    }
    ptVar2 = (item->_M_t).
             super___uniq_ptr_impl<dlib::thread_function,_std::default_delete<dlib::thread_function>_>
             ._M_t.
             super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>
             .super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl;
    (item->_M_t).
    super___uniq_ptr_impl<dlib::thread_function,_std::default_delete<dlib::thread_function>_>._M_t.
    super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>.
    super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl =
         local_58.array_elements[local_58.array_size - 1]._M_t.
         super___uniq_ptr_impl<dlib::thread_function,_std::default_delete<dlib::thread_function>_>.
         _M_t.
         super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>
         .super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl;
    local_58.array_elements[local_58.array_size - 1]._M_t.
    super___uniq_ptr_impl<dlib::thread_function,_std::default_delete<dlib::thread_function>_>._M_t.
    super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>.
    super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl = ptVar2;
    swap(&local_58,this);
    ~array(&local_58);
  }
  else {
    iVar4 = (*(this->
              super_enumerable<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>_>
              )._vptr_enumerable[8])(this);
    set_size(this,CONCAT44(extraout_var_03,iVar4) + 1);
    iVar4 = (*(this->
              super_enumerable<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>_>
              )._vptr_enumerable[8])(this);
    puVar3 = this->array_elements;
    ptVar2 = (item->_M_t).
             super___uniq_ptr_impl<dlib::thread_function,_std::default_delete<dlib::thread_function>_>
             ._M_t.
             super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>
             .super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl;
    (item->_M_t).
    super___uniq_ptr_impl<dlib::thread_function,_std::default_delete<dlib::thread_function>_>._M_t.
    super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>.
    super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl =
         puVar3[CONCAT44(extraout_var_04,iVar4) + -1]._M_t.
         super___uniq_ptr_impl<dlib::thread_function,_std::default_delete<dlib::thread_function>_>.
         _M_t.
         super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>
         .super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl;
    puVar3[CONCAT44(extraout_var_04,iVar4) + -1]._M_t.
    super___uniq_ptr_impl<dlib::thread_function,_std::default_delete<dlib::thread_function>_>._M_t.
    super__Tuple_impl<0UL,_dlib::thread_function_*,_std::default_delete<dlib::thread_function>_>.
    super__Head_base<0UL,_dlib::thread_function_*,_false>._M_head_impl = ptVar2;
  }
  return;
}

Assistant:

void array<T,mem_manager>::
    push_back (
        T& item
    ) 
    {
        if (this->max_size() == this->size())
        {
            // double the size of the array
            array temp;
            temp.set_max_size(this->size()*2 + 1);
            temp.set_size(this->size()+1);
            for (unsigned long i = 0; i < this->size(); ++i)
            {
                exchange((*this)[i],temp[i]);
            }
            exchange(item,temp[temp.size()-1]);
            temp.swap(*this);
        }
        else
        {
            this->set_size(this->size()+1);
            exchange(item,(*this)[this->size()-1]);
        }
    }